

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

void __thiscall
HighsSearch::branchDownwards(HighsSearch *this,HighsInt col,double newub,double branchpoint)

{
  bool bVar1;
  HighsInt HVar2;
  reference pvVar3;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *this_00;
  size_type sVar4;
  HighsInt in_ESI;
  HighsDomain *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  Reason unaff_retaddr;
  HighsDomainChange in_stack_00000008;
  bool passStabilizerToChildNode;
  HighsInt domchgPos;
  NodeData *currnode;
  shared_ptr<const_StabilizerOrbits> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  pointer *__args_2;
  HighsSearch *in_stack_ffffffffffffff78;
  pointer *__args;
  HighsDomain *this_01;
  
  this_01 = in_RDI;
  pvVar3 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                     ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  pvVar3->opensubtrees = '\x01';
  pvVar3->branching_point = in_XMM1_Qa;
  (pvVar3->branchingdecision).column = in_ESI;
  (pvVar3->branchingdecision).boundval = in_XMM0_Qa;
  (pvVar3->branchingdecision).boundtype = kUpper;
  this_00 = HighsDomain::getDomainChangeStack
                      ((HighsDomain *)
                       &(in_RDI->changedcolsflags_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  sVar4 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(this_00);
  HVar2 = (HighsInt)sVar4;
  bVar1 = orbitsValidInChildNode(in_stack_ffffffffffffff78,(HighsDomainChange *)in_RDI);
  __args_2 = &(in_RDI->changedcolsflags_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  HighsDomain::Reason::branching();
  HighsDomain::changeBound(this_01,in_stack_00000008,unaff_retaddr);
  __args = &in_RDI[1].activitymax_.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (bVar1) {
    std::shared_ptr<const_StabilizerOrbits>::shared_ptr
              ((shared_ptr<const_StabilizerOrbits> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
  }
  else {
    std::shared_ptr<const_StabilizerOrbits>::shared_ptr
              ((shared_ptr<const_StabilizerOrbits> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
  }
  std::vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>>::
  emplace_back<double&,double&,std::shared_ptr<HighsBasis_const>&,std::shared_ptr<StabilizerOrbits_const>>
            ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)pvVar3,
             (double *)__args,(double *)in_RDI,(shared_ptr<const_HighsBasis> *)__args_2,
             (shared_ptr<const_StabilizerOrbits> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::shared_ptr<const_StabilizerOrbits>::~shared_ptr
            ((shared_ptr<const_StabilizerOrbits> *)0x68faed);
  pvVar3 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                     ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                      CONCAT44(HVar2,in_stack_ffffffffffffff60));
  pvVar3->domgchgStackPos = HVar2;
  return;
}

Assistant:

void HighsSearch::branchDownwards(HighsInt col, double newub,
                                  double branchpoint) {
  NodeData& currnode = nodestack.back();

  assert(currnode.opensubtrees == 2);
  assert(mipsolver.variableType(col) != HighsVarType::kContinuous);

  currnode.opensubtrees = 1;
  currnode.branching_point = branchpoint;
  currnode.branchingdecision.column = col;
  currnode.branchingdecision.boundval = newub;
  currnode.branchingdecision.boundtype = HighsBoundType::kUpper;

  HighsInt domchgPos = localdom.getDomainChangeStack().size();
  bool passStabilizerToChildNode =
      orbitsValidInChildNode(currnode.branchingdecision);
  localdom.changeBound(currnode.branchingdecision);
  nodestack.emplace_back(
      currnode.lower_bound, currnode.estimate, currnode.nodeBasis,
      passStabilizerToChildNode ? currnode.stabilizerOrbits : nullptr);
  nodestack.back().domgchgStackPos = domchgPos;
}